

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setopt.c
# Opt level: O3

CURLcode Curl_setstropt(char **charp,char *s)

{
  size_t sVar1;
  char *pcVar2;
  
  (*Curl_cfree)(*charp);
  *charp = (char *)0x0;
  if (s != (char *)0x0) {
    sVar1 = strlen(s);
    if (8000000 < sVar1) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    pcVar2 = (*Curl_cstrdup)(s);
    *charp = pcVar2;
    if (pcVar2 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_setstropt(char **charp, const char *s)
{
  /* Release the previous storage at `charp' and replace by a dynamic storage
     copy of `s'. Return CURLE_OK or CURLE_OUT_OF_MEMORY. */

  Curl_safefree(*charp);

  if(s) {
    if(strlen(s) > CURL_MAX_INPUT_LENGTH)
      return CURLE_BAD_FUNCTION_ARGUMENT;

    *charp = strdup(s);
    if(!*charp)
      return CURLE_OUT_OF_MEMORY;
  }

  return CURLE_OK;
}